

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

nifti_1_header * nifti_read_header(char *hname,int *swapped,int check)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  nifti_1_header *__dest;
  int iVar4;
  char fname [18];
  znzFile fp;
  nifti_1_header nhdr;
  char local_1a8 [24];
  znzFile local_190;
  nifti_1_header local_184;
  
  builtin_strncpy(local_1a8,"nifti_read_header",0x12);
  pcVar2 = nifti_findhdrname(hname);
  if (pcVar2 == (char *)0x0) {
    if (0 < g_opts_0) {
      pcVar2 = "failed to find header file for";
      goto LAB_0010cb37;
    }
  }
  else {
    if (1 < g_opts_0) {
      fprintf(_stderr,"-d %s: found header filename \'%s\'\n",local_1a8,pcVar2);
    }
    iVar1 = nifti_is_gzfile(pcVar2);
    local_190 = znzopen(pcVar2,"rb",iVar1);
    if (local_190 == (znzFile)0x0) {
      if (0 < g_opts_0) {
        fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_1a8,"failed to open header file",pcVar2);
      }
      free(pcVar2);
    }
    else {
      free(pcVar2);
      iVar1 = has_ascii_header(local_190);
      if (iVar1 == 1) {
        Xznzclose(&local_190);
        if (0 < g_opts_0) {
          pcVar2 = "ASCII header type not supported";
LAB_0010cb37:
          fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_1a8,pcVar2,hname);
          return (nifti_1_header *)0x0;
        }
      }
      else {
        sVar3 = znzread(&local_184,1,0x15c,local_190);
        Xznzclose(&local_190);
        if (0x15b < (int)sVar3) {
          iVar1 = need_nhdr_swap(local_184.dim[0],local_184.sizeof_hdr);
          if (iVar1 < 0 && check != 0) {
            pcVar2 = "bad nifti_1_header for file";
          }
          else {
            if ((iVar1 < 0) && (iVar1 = 0, 1 < g_opts_0)) {
              nifti_read_header_cold_1();
            }
            if (iVar1 != 0) {
              if (3 < g_opts_0) {
                disp_nifti_1_header("-d nhdr pre-swap: ",&local_184);
              }
              iVar4 = 0;
              if (((local_184.magic[0] == 'n') && (iVar4 = 0, local_184.magic[3] == '\0')) &&
                 ((byte)(local_184.magic[2] - 0x31U) < 9 &&
                  (local_184.magic[1] == '+' || local_184.magic[1] == 'i'))) {
                iVar4 = (byte)local_184.magic[2] - 0x30;
              }
              swap_nifti_header(&local_184,iVar4);
            }
            if (2 < g_opts_0) {
              disp_nifti_1_header("-d nhdr post-swap: ",&local_184);
            }
            if ((check == 0) || (iVar4 = nifti_hdr_looks_good(&local_184), iVar4 != 0)) {
              __dest = (nifti_1_header *)malloc(0x15c);
              if (__dest == (nifti_1_header *)0x0) {
                nifti_read_header_cold_2();
                return (nifti_1_header *)0x0;
              }
              if (swapped != (int *)0x0) {
                *swapped = iVar1;
              }
              memcpy(__dest,&local_184,0x15c);
              return __dest;
            }
            pcVar2 = "nifti_1_header looks bad for file";
          }
          goto LAB_0010cb37;
        }
        if (0 < g_opts_0) {
          fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_1a8,"bad binary header read for file",
                  hname);
          fprintf(_stderr,"  - read %d of %d bytes\n",sVar3 & 0xffffffff,0x15c);
          return (nifti_1_header *)0x0;
        }
      }
    }
  }
  return (nifti_1_header *)0x0;
}

Assistant:

nifti_1_header * nifti_read_header(const char * hname, int * swapped, int check)
{
   nifti_1_header   nhdr, * hptr;
   znzFile          fp;
   int              bytes, lswap;
   char           * hfile;
   char             fname[] = { "nifti_read_header" };

   /* determine file name to use for header */
   hfile = nifti_findhdrname(hname);
   if( hfile == NULL ){
      if( g_opts.debug > 0 )
         LNI_FERR(fname,"failed to find header file for", hname);
      return NULL;
   } else if( g_opts.debug > 1 )
      fprintf(stderr,"-d %s: found header filename '%s'\n",fname,hfile);

   fp = znzopen( hfile, "rb", nifti_is_gzfile(hfile) );
   if( znz_isnull(fp) ){
      if( g_opts.debug > 0 ) LNI_FERR(fname,"failed to open header file",hfile);
      free(hfile);
      return NULL;
   }

   free(hfile);  /* done with filename */

   if( has_ascii_header(fp) == 1 ){
      znzclose( fp );
      if( g_opts.debug > 0 )
         LNI_FERR(fname,"ASCII header type not supported",hname);
      return NULL;
   }

   /* read the binary header */
   bytes = (int)znzread( &nhdr, 1, sizeof(nhdr), fp );
   znzclose( fp );                      /* we are done with the file now */

   if( bytes < (int)sizeof(nhdr) ){
      if( g_opts.debug > 0 ){
         LNI_FERR(fname,"bad binary header read for file", hname);
         fprintf(stderr,"  - read %d of %d bytes\n",bytes, (int)sizeof(nhdr));
      }
      return NULL;
   }

   /* now just decide on byte swapping */
   lswap = need_nhdr_swap(nhdr.dim[0], nhdr.sizeof_hdr); /* swap data flag */
   if( check && lswap < 0 ){
      LNI_FERR(fname,"bad nifti_1_header for file", hname);
      return NULL;
   } else if ( lswap < 0 ) {
      lswap = 0;  /* if swapping does not help, don't do it */
      if(g_opts.debug > 1) fprintf(stderr,"-- swap failure, none applied\n");
   }

   if( lswap ) {
      if ( g_opts.debug > 3 ) disp_nifti_1_header("-d nhdr pre-swap: ", &nhdr);
      swap_nifti_header( &nhdr , NIFTI_VERSION(nhdr) ) ;
   }

   if ( g_opts.debug > 2 ) disp_nifti_1_header("-d nhdr post-swap: ", &nhdr);

   if ( check && ! nifti_hdr_looks_good(&nhdr) ){
      LNI_FERR(fname,"nifti_1_header looks bad for file", hname);
      return NULL;
   }

   /* all looks good, so allocate memory for and return the header */
   hptr = (nifti_1_header *)malloc(sizeof(nifti_1_header));
   if( ! hptr ){
      fprintf(stderr,"** nifti_read_hdr: failed to alloc nifti_1_header\n");
      return NULL;
   }

   if( swapped ) *swapped = lswap;  /* only if they care <sniff!> */

   memcpy(hptr, &nhdr, sizeof(nifti_1_header));

   return hptr;
}